

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O1

iuIParamGenerator<int> * __thiscall
iutest::detail::iuConcatParamHolder::operator_cast_to_iuIParamGenerator_(iuConcatParamHolder *this)

{
  iuIParamGenerator<int> *piVar1;
  params_t<int> params;
  vector<int,_std::allocator<int>_> local_28;
  
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar1 = operator_cast_to_iuIParamGenerator_(this);
  iuConcatParamHolder<iutest::detail::iuConcatParamHolder<iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<bool>_>,_iutest::detail::iuValueArray<int,_int>_>
  ::params_t<int>::append((params_t<int> *)&local_28,piVar1);
  piVar1 = iuValueArray::operator_cast_to_iuIParamGenerator_((iuValueArray *)(this + 0x20));
  iuConcatParamHolder<iutest::detail::iuConcatParamHolder<iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<bool>_>,_iutest::detail::iuValueArray<int,_int>_>
  ::params_t<int>::append((params_t<int> *)&local_28,piVar1);
  piVar1 = (iuIParamGenerator<int> *)operator_new(0x28);
  piVar1->_vptr_iuIParamGenerator = (_func_int **)&PTR__iuValuesInParamsGenerator_001b5cd8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(piVar1 + 1),&local_28);
  piVar1[4]._vptr_iuIParamGenerator = (_func_int **)0x0;
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return piVar1;
}

Assistant:

operator iuIParamGenerator<T>* ()
    {
        params_t<T> params;
        params.append(m_g1);
        params.append(m_g2);
        return new iuValuesInParamsGenerator<T>(params.val);
    }